

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

node_type * __thiscall Tree<NULLC::Range>::right_rotate(Tree<NULLC::Range> *this,node_type *y)

{
  node_type *pnVar1;
  node<NULLC::Range> *pnVar2;
  int iVar3;
  int iVar4;
  node_type *T2;
  node_type *x;
  node_type *y_local;
  Tree<NULLC::Range> *this_local;
  
  pnVar1 = y->left;
  pnVar2 = pnVar1->right;
  pnVar1->right = y;
  y->left = pnVar2;
  iVar3 = get_height(this,y->left);
  iVar4 = get_height(this,y->right);
  iVar3 = detail::max<int>(iVar3,iVar4);
  y->height = iVar3 + 1;
  iVar3 = get_height(this,pnVar1->left);
  iVar4 = get_height(this,pnVar1->right);
  iVar3 = detail::max<int>(iVar3,iVar4);
  pnVar1->height = iVar3 + 1;
  return pnVar1;
}

Assistant:

node_type* right_rotate(node_type* y)
	{
		node_type *x = y->left;
		node_type *T2 = x->right;

		x->right = y;
		y->left = T2;

		y->height = detail::max(get_height(y->left), get_height(y->right)) + 1;
		x->height = detail::max(get_height(x->left), get_height(x->right)) + 1;

		return x;
	}